

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLRootParser14.cpp
# Opt level: O0

LibraryAnimationClipsLoader * __thiscall
COLLADASaxFWL::RootParser14::
beginCommonWithId<COLLADASaxFWL::LibraryAnimationClipsLoader,COLLADASaxFWL::LibraryAnimationClipsLoader14>
          (RootParser14 *this,char *id)

{
  LibraryAnimationClipsLoader *this_00;
  IParserImpl *parserImpl;
  long in_RDI;
  LibraryAnimationClipsLoader14 *loader14;
  LibraryAnimationClipsLoader *loader;
  LibraryAnimationClipsLoader *in_stack_ffffffffffffff98;
  LibraryAnimationClipsLoader14 *in_stack_ffffffffffffffa0;
  IFilePartLoader *in_stack_ffffffffffffffa8;
  LibraryAnimationClipsLoader *in_stack_ffffffffffffffb0;
  IParserImpl *pIVar1;
  
  IFilePartLoader::deleteFilePartLoader((IFilePartLoader *)in_stack_ffffffffffffffa0);
  this_00 = (LibraryAnimationClipsLoader *)operator_new(0x58);
  LibraryAnimationClipsLoader::LibraryAnimationClipsLoader
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  parserImpl = (IParserImpl *)operator_new(0x20);
  LibraryAnimationClipsLoader14::LibraryAnimationClipsLoader14
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  IFilePartLoader::setParserImpl((IFilePartLoader *)this_00,parserImpl);
  IFilePartLoader::setPartLoader(*(IFilePartLoader **)(in_RDI + 0x20),(IFilePartLoader *)this_00);
  pIVar1 = (IParserImpl *)0x0;
  if (parserImpl != (IParserImpl *)0x0) {
    pIVar1 = parserImpl + 1;
  }
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x48))(*(long **)(in_RDI + 0x20),pIVar1);
  DocumentProcessor::addToSidTree((DocumentProcessor *)this,id,(char *)loader);
  return this_00;
}

Assistant:

Loader* RootParser14::beginCommonWithId( const char * id)
	{
		mFileLoader->deleteFilePartLoader();
		Loader* loader = new Loader(mFileLoader);
		Loader14* loader14 = new Loader14(loader);
		loader->setParserImpl( loader14 );
		mFileLoader->setPartLoader(loader);
		mFileLoader->setParser(loader14);
		mFileLoader->addToSidTree( id, 0);
		return loader;
	}